

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

void json_decode_descend(lua_State *l,json_parse_t *json,int slots)

{
  int iVar1;
  
  iVar1 = json->current_depth;
  json->current_depth = iVar1 + 1;
  if (iVar1 < json->cfg->decode_max_depth) {
    iVar1 = lua_checkstack(l,slots);
    if (iVar1 != 0) {
      return;
    }
  }
  strbuf_free(json->tmp);
  luaL_error(l,"Found too many nested data structures (%d) at character %d",
             (ulong)(uint)json->current_depth,(long)json->ptr - (long)json->data);
  return;
}

Assistant:

static void json_decode_descend(lua_State *l, json_parse_t *json, int slots)
{
    json->current_depth++;

    if (json->current_depth <= json->cfg->decode_max_depth &&
        lua_checkstack(l, slots)) {
        return;
    }

    strbuf_free(json->tmp);
    luaL_error(l, "Found too many nested data structures (%d) at character %d",
        json->current_depth, json->ptr - json->data);
}